

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

FunctionCall * __thiscall
soul::PoolAllocator::
allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
          (PoolAllocator *this,CodeLocation *args,pool_ptr<soul::heart::Expression> *args_1,
          Function *args_2)

{
  PoolItem *pPVar1;
  CodeLocation local_48;
  pool_ptr<soul::heart::Function> local_38;
  pool_ptr<soul::heart::Expression> local_30;
  
  pPVar1 = allocateSpaceForObject(this,0x68);
  local_48.sourceCode.object = (args->sourceCode).object;
  if (local_48.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_48.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_48.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_48.location.data = (args->location).data;
  local_30 = (pool_ptr<soul::heart::Expression>)args_1->object;
  local_38.object = args_2;
  heart::FunctionCall::FunctionCall((FunctionCall *)&pPVar1->item,&local_48,&local_30,&local_38);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.sourceCode.object);
  pPVar1->destructor =
       allocate<soul::heart::FunctionCall,_const_soul::CodeLocation_&,_soul::pool_ptr<soul::heart::Expression>,_soul::heart::Function_&>
       ::anon_class_1_0_00000001::__invoke;
  return (FunctionCall *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }